

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

Span<Potassco::WeightLit_t> __thiscall
Potassco::SmodelsConvert::SmData::mapLits<Potassco::WeightLit_t>
          (SmData *this,Span<Potassco::WeightLit_t> *in,
          vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *out)

{
  pointer pWVar1;
  WeightLit_t *pWVar2;
  WeightLit_t *pWVar3;
  Span<Potassco::WeightLit_t> SVar4;
  WeightLit_t local_30;
  
  pWVar1 = (out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>).
      _M_impl.super__Vector_impl_data._M_finish != pWVar1) {
    (out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>)._M_impl
    .super__Vector_impl_data._M_finish = pWVar1;
  }
  pWVar2 = in->first;
  for (pWVar3 = pWVar2; pWVar3 != pWVar2 + in->size; pWVar3 = pWVar3 + 1) {
    local_30 = mapLit(this,*pWVar3);
    std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
    emplace_back<Potassco::WeightLit_t>(out,&local_30);
    pWVar2 = in->first;
  }
  SVar4 = toSpan<std::vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>>(out);
  return SVar4;
}

Assistant:

Span<T>  mapLits(const Span<T>& in, std::vector<T>& out) {
		out.clear();
		for (typename Span<T>::iterator x = begin(in); x != end(in); ++x) { out.push_back(mapLit(*x)); }
		return toSpan(out);
	}